

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_0::LRUCache::Unref(LRUCache *this,LRUHandle *e)

{
  LRUHandle *pLVar1;
  uint32_t uVar2;
  long in_FS_OFFSET;
  Slice local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (e->refs == 0) {
    __assert_fail("e->refs > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                  ,0xe2,"void leveldb::(anonymous namespace)::LRUCache::Unref(LRUHandle *)");
  }
  uVar2 = e->refs - 1;
  e->refs = uVar2;
  if (uVar2 == 0) {
    if (e->in_cache != false) {
      __assert_fail("!e->in_cache",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                    ,0xe5,"void leveldb::(anonymous namespace)::LRUCache::Unref(LRUHandle *)");
    }
    if (e->next == e) {
      __assert_fail("next != this",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/cache.cc"
                    ,0x3a,"Slice leveldb::(anonymous namespace)::LRUHandle::key() const");
    }
    local_20.data_ = e->key_data;
    local_20.size_ = e->key_length;
    (*e->deleter)(&local_20,e->value);
    free(e);
  }
  else if (uVar2 == 1 && e->in_cache == true) {
    pLVar1 = e->next;
    pLVar1->prev = e->prev;
    e->prev->next = pLVar1;
    e->next = &this->lru_;
    pLVar1 = (this->lru_).prev;
    e->prev = pLVar1;
    pLVar1->next = e;
    e->next->prev = e;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LRUCache::Unref(LRUHandle* e) {
  assert(e->refs > 0);
  e->refs--;
  if (e->refs == 0) {  // Deallocate.
    assert(!e->in_cache);
    (*e->deleter)(e->key(), e->value);
    free(e);
  } else if (e->in_cache && e->refs == 1) {
    // No longer in use; move to lru_ list.
    LRU_Remove(e);
    LRU_Append(&lru_, e);
  }
}